

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::StencilFuncSeparateTestCase::test
          (StencilFuncSeparateTestCase *this)

{
  int local_3c;
  int ndx;
  GLenum stencilfuncValues [8];
  StencilFuncSeparateTestCase *this_local;
  
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_stencilFuncName,0x207);
  ApiCase::expectError(&this->super_ApiCase,0);
  stencilfuncValues[0] = 0x201;
  stencilfuncValues[1] = 0x203;
  stencilfuncValues[2] = 0x202;
  stencilfuncValues[3] = 0x206;
  stencilfuncValues[4] = 0x204;
  stencilfuncValues[5] = 0x205;
  for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
    glu::CallLogWrapper::glStencilFuncSeparate
              (&(this->super_ApiCase).super_CallLogWrapper,this->m_stencilFuncFace,
               stencilfuncValues[(long)local_3c + -2],0,0);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_stencilFuncName,(ulong)stencilfuncValues[(long)local_3c + -2]);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, m_stencilFuncName, GL_ALWAYS);
		expectError(GL_NO_ERROR);

		const GLenum stencilfuncValues[] = {GL_NEVER, GL_ALWAYS, GL_LESS, GL_LEQUAL, GL_EQUAL, GL_GEQUAL, GL_GREATER, GL_NOTEQUAL};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilfuncValues); ++ndx)
		{
			glStencilFuncSeparate(m_stencilFuncFace, stencilfuncValues[ndx], 0, 0);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_stencilFuncName, stencilfuncValues[ndx]);
			expectError(GL_NO_ERROR);
		}
	}